

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

long xmlSaveTree(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  uint uVar1;
  htmlDocPtr doc;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *encoding;
  
  if (cur == (xmlNodePtr)0x0 || ctxt == (xmlSaveCtxtPtr)0x0) {
    return -1;
  }
  uVar1 = ctxt->options;
  if ((uVar1 & 0x10) != 0) {
    xhtmlNodeDumpOutput(ctxt,cur);
    return 0;
  }
  if ((cur->type == XML_NAMESPACE_DECL) || (cur->doc == (_xmlDoc *)0x0)) {
    if ((uVar1 & 0x40) == 0) goto LAB_0016773e;
  }
  else if (((uVar1 & 0x40) == 0) &&
          ((uVar1 & 0x20) != 0 || cur->doc->type != XML_HTML_DOCUMENT_NODE)) {
LAB_0016773e:
    xmlNodeDumpOutputInternal(ctxt,cur);
    return 0;
  }
  xmlInitParser();
  encoding = ctxt->encoding;
  doc = cur->doc;
  pxVar3 = encoding;
  if (doc != (htmlDocPtr)0x0) {
    if ((encoding == (xmlChar *)0x0) && (encoding = doc->encoding, encoding == (xmlChar *)0x0)) {
      encoding = (xmlChar *)0x0;
      goto LAB_001677c7;
    }
    htmlSetMetaEncoding(doc,encoding);
    pxVar3 = ctxt->encoding;
  }
  if (pxVar3 != (xmlChar *)0x0) {
    htmlNodeDumpFormatOutput(ctxt->buf,doc,cur,(char *)0x0,ctxt->options & 1);
    return 0;
  }
LAB_001677c7:
  if ((doc != (htmlDocPtr)0x0) && (encoding == (xmlChar *)0x0)) {
    encoding = htmlGetMetaEncoding(doc);
  }
  pxVar3 = (xmlChar *)"HTML";
  if (encoding != (xmlChar *)0x0) {
    pxVar3 = encoding;
  }
  iVar2 = xmlSaveSwitchEncoding(ctxt,(char *)pxVar3);
  if (iVar2 < 0) {
    return 0;
  }
  htmlNodeDumpFormatOutput(ctxt->buf,doc,cur,(char *)0x0,ctxt->options & 1);
  xmlSaveClearEncoding(ctxt);
  return 0;
}

Assistant:

long
xmlSaveTree(xmlSaveCtxtPtr ctxt, xmlNodePtr cur)
{
    long ret = 0;

    if ((ctxt == NULL) || (cur == NULL)) return(-1);
#ifdef LIBXML_HTML_ENABLED
    if (ctxt->options & XML_SAVE_XHTML) {
        xhtmlNodeDumpOutput(ctxt, cur);
        return(ret);
    }
    if (((cur->type != XML_NAMESPACE_DECL) && (cur->doc != NULL) &&
         (cur->doc->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
	htmlNodeDumpOutputInternal(ctxt, cur);
	return(ret);
    }
#endif
    xmlNodeDumpOutputInternal(ctxt, cur);
    return(ret);
}